

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<3U,_3U>::do_move(GoState<3U,_3U> *this,Move move)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int in_ESI;
  pair<int,_int> *in_RDI;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  int j;
  int i;
  int opponent;
  int in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  tuple<int_&,_int_&> *in_stack_ffffffffffffff80;
  value_type_conflict *in_stack_ffffffffffffff88;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff90;
  uint local_18;
  uint local_14;
  
  in_RDI[9].first = in_RDI[9].first + 1;
  uVar2 = 3 - in_RDI[9].second;
  if (in_ESI == -1) {
    in_RDI[9].second = uVar2;
  }
  else {
    ind_to_ij((int)((ulong)in_RDI >> 0x20));
    std::tie<int,int>(&in_RDI->first,
                      (int *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::tuple<int&,int&>::operator=(in_stack_ffffffffffffff80,in_RDI);
    uVar4 = (**(code **)((long)*in_RDI + 0x28))(in_RDI,local_14,local_18);
    if ((uVar4 & 1) == 0) {
      MCTS::assertion_failed(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
    }
    *(char *)((long)&in_RDI[1].first + (long)(int)local_18 + (long)(int)local_14 * 3) =
         (char)in_RDI[9].second;
    iVar3 = (**(code **)((long)*in_RDI + 0x20))();
    in_RDI[2].second = iVar3;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if ((0 < (int)local_14) &&
       (*(byte *)((long)&in_RDI[1].first + (long)(int)local_18 + (long)(int)(local_14 - 1) * 3) ==
        uVar2)) {
      (**(code **)((long)*in_RDI + 0x50))(in_RDI,local_14 - 1,local_18);
    }
    if ((local_14 < 2) &&
       (*(byte *)((long)&in_RDI[1].first + (long)(int)local_18 + (long)(int)(local_14 + 1) * 3) ==
        uVar2)) {
      (**(code **)((long)*in_RDI + 0x50))(in_RDI,local_14 + 1,local_18);
    }
    if ((0 < (int)local_18) &&
       (*(byte *)((long)&in_RDI[1].first + (long)(int)(local_18 - 1) + (long)(int)local_14 * 3) ==
        uVar2)) {
      (**(code **)((long)*in_RDI + 0x50))(in_RDI,local_14,local_18 - 1);
    }
    if ((local_18 < 2) &&
       (*(byte *)((long)&in_RDI[1].first + (long)(int)(local_18 + 1) + (long)(int)local_14 * 3) ==
        uVar2)) {
      (**(code **)((long)*in_RDI + 0x50))(in_RDI,local_14,local_18 + 1);
    }
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           *)0x1b2ab4);
    if ((uint)*(byte *)((long)&in_RDI[1].first + (long)(int)local_18 + (long)(int)local_14 * 3) !=
        in_RDI[9].second) {
      MCTS::assertion_failed(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
    }
    bVar1 = (**(code **)((long)*in_RDI + 0x48))(in_RDI,local_14,local_18,&stack0xffffffffffffff90);
    if ((bVar1 & 1) == 0) {
      MCTS::assertion_failed(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
    }
    in_RDI[9].second = uVar2;
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            *)0x1b2b7c);
  }
  return;
}

Assistant:

virtual void do_move(Move move)
	{
		depth++;

		int opponent = 3 - player_to_move;

		if (move == pass) {
			player_to_move = opponent;
			return;
		}

		int i,j;
		std::tie(i, j) = ind_to_ij(move);
		attest(is_move_possible(i, j));

		board[i][j] = player_to_move;

		// We save the hash values before all captures as this is way easier
		// to check.
		previous_board_hash_value = compute_hash_value();
		all_hash_values.insert(previous_board_hash_value);

		// Check for the killing of any opposing stones.
		if (i > 0 && board[i - 1][j] == opponent) {
			check_alive(i - 1, j);
		}
		if (i < M - 1 && board[i + 1][j] == opponent) {
			check_alive(i + 1, j);
		}
		if (j > 0 && board[i][j - 1] == opponent) {
			check_alive(i, j - 1);
		}
		if (j < N - 1 && board[i][j + 1] == opponent) {
			check_alive(i, j + 1);
		}

		std::set<std::pair<int, int>> pieces;
		// Now the played stone must be alive.
		attest(board[i][j] == player_to_move);
		attest(is_alive(i, j, &pieces));

		// Next player
		player_to_move = opponent;
	}